

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O2

SerializedCSVReaderOptions *
duckdb::SerializedCSVReaderOptions::Deserialize
          (SerializedCSVReaderOptions *__return_storage_ptr__,Deserializer *deserializer)

{
  bool bVar1;
  FileCompressionType FVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  CSVOption<char> single_byte_delimiter;
  CSVOption<char> CVar10;
  CSVOption<char> CVar11;
  CSVOption<bool> CVar12;
  CSVOption<duckdb::NewLineIdentifier> CVar13;
  CSVOption<char> CVar14;
  CSVOption<bool> CVar15;
  unsigned_long uVar16;
  unsigned_long uVar17;
  unsigned_long uVar18;
  unsigned_long uVar19;
  unsigned_long uVar20;
  CSVOption<unsigned_long> CVar21;
  CSVOption<unsigned_long> CVar22;
  undefined4 local_3c7;
  undefined3 uStack_3c3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> options_rejects_table_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  vector<duckdb::LogicalType,_true> options_sql_type_list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  options_name_list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  options_null_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> options_encoding;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
  options_sniffer_user_mismatch_error;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> options_decimal_separator;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> options_file_path;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  options_sql_types_per_column;
  CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  options_multi_byte_delimiter;
  undefined1 local_1e8 [40];
  CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  options_rejects_scan_name;
  vector<bool,_true> options_was_type_manually_set;
  vector<bool,_true> options_force_quote;
  vector<bool,_true> options_force_not_null;
  map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
  options_dialect_options_date_format;
  undefined1 local_f0 [40];
  MultiFileOptions file_options;
  
  bVar1 = Deserializer::ReadPropertyWithExplicitDefault<bool>
                    (deserializer,100,"ignore_errors",false);
  uVar16 = Deserializer::ReadPropertyWithDefault<unsigned_long>
                     (deserializer,0x65,"buffer_sample_size");
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (&options_null_str,deserializer,0x66,"null_str");
  FVar2 = Deserializer::ReadProperty<duckdb::FileCompressionType>(deserializer,0x67,"compression");
  bVar3 = Deserializer::ReadPropertyWithDefault<bool>(deserializer,0x68,"allow_quoted_nulls");
  CVar21 = Deserializer::ReadProperty<duckdb::CSVOption<unsigned_long>>
                     (deserializer,0x69,"maximum_line_size");
  bVar4 = Deserializer::ReadPropertyWithDefault<bool>(deserializer,0x6a,"normalize_names");
  Deserializer::ReadPropertyWithDefault<duckdb::vector<bool,true>>
            (&options_force_not_null,deserializer,0x6b,"force_not_null");
  bVar5 = Deserializer::ReadPropertyWithDefault<bool>(deserializer,0x6c,"all_varchar");
  uVar17 = Deserializer::ReadPropertyWithDefault<unsigned_long>
                     (deserializer,0x6d,"sample_size_chunks");
  bVar6 = Deserializer::ReadPropertyWithDefault<bool>(deserializer,0x6e,"auto_detect");
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (&options_file_path,deserializer,0x6f,"file_path");
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (&options_decimal_separator,deserializer,0x70,"decimal_separator");
  bVar7 = Deserializer::ReadPropertyWithDefault<bool>(deserializer,0x71,"null_padding");
  Deserializer::ReadDeletedProperty<unsigned_long>(deserializer,0x72,"buffer_size");
  Deserializer::ReadProperty<duckdb::MultiFileOptions>
            (&file_options,deserializer,0x73,"file_options");
  Deserializer::ReadPropertyWithDefault<duckdb::vector<bool,true>>
            (&options_force_quote,deserializer,0x74,"force_quote");
  ::std::__cxx11::string::string
            ((string *)&local_2a8,"reject_errors",(allocator *)&options_sql_types_per_column);
  Deserializer::ReadPropertyWithExplicitDefault<std::__cxx11::string>
            (&options_rejects_table_name,deserializer,0x75,"rejects_table_name",&local_2a8);
  ::std::__cxx11::string::~string((string *)&local_2a8);
  uVar18 = Deserializer::ReadPropertyWithDefault<unsigned_long>(deserializer,0x76,"rejects_limit");
  Deserializer::ReadDeletedProperty<duckdb::vector<std::__cxx11::string,true>>
            (deserializer,0x77,"rejects_recovery_columns");
  Deserializer::ReadDeletedProperty<duckdb::vector<unsigned_long,true>>
            (deserializer,0x78,"rejects_recovery_column_ids");
  single_byte_delimiter =
       Deserializer::ReadProperty<duckdb::CSVOption<char>>(deserializer,0x79,"delimiter");
  CVar10 = Deserializer::ReadProperty<duckdb::CSVOption<char>>(deserializer,0x7a,"quote");
  CVar11 = Deserializer::ReadProperty<duckdb::CSVOption<char>>(deserializer,0x7b,"escape");
  CVar12 = Deserializer::ReadProperty<duckdb::CSVOption<bool>>(deserializer,0x7c,"header");
  uVar19 = Deserializer::ReadPropertyWithDefault<unsigned_long>(deserializer,0x7d,"num_cols");
  CVar13 = Deserializer::ReadProperty<duckdb::CSVOption<duckdb::NewLineIdentifier>>
                     (deserializer,0x7e,"new_line");
  CVar22 = Deserializer::ReadProperty<duckdb::CSVOption<unsigned_long>>
                     (deserializer,0x7f,"skip_rows");
  Deserializer::
  ReadProperty<std::map<duckdb::LogicalTypeId,duckdb::CSVOption<duckdb::StrpTimeFormat>,std::less<duckdb::LogicalTypeId>,std::allocator<std::pair<duckdb::LogicalTypeId_const,duckdb::CSVOption<duckdb::StrpTimeFormat>>>>>
            (&options_dialect_options_date_format,deserializer,0x80,"date_format");
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (&options_sniffer_user_mismatch_error,deserializer,0x81,"sniffer_user_mismatch_error");
  bVar8 = Deserializer::ReadPropertyWithDefault<bool>(deserializer,0x82,"parallel");
  Deserializer::ReadPropertyWithDefault<duckdb::vector<bool,true>>
            (&options_was_type_manually_set,deserializer,0x83,"was_type_manually_set");
  ::std::__cxx11::string::string
            ((string *)&local_2e8,"reject_scans",(allocator *)&options_sql_types_per_column);
  CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  CSVOption((CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_1e8,&local_2e8);
  Deserializer::ReadPropertyWithExplicitDefault<duckdb::CSVOption<std::__cxx11::string>>
            (&options_rejects_scan_name,deserializer,0x84,"rejects_scan_name",
             (CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1e8);
  ::std::__cxx11::string::~string((string *)(local_1e8 + 8));
  ::std::__cxx11::string::~string((string *)&local_2e8);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (&options_name_list,deserializer,0x85,"name_list");
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::LogicalType,true>>
            (&options_sql_type_list,deserializer,0x86,"sql_type_list");
  Deserializer::
  ReadPropertyWithDefault<std::unordered_map<std::__cxx11::string,unsigned_long,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>>
            (&options_sql_types_per_column,deserializer,0x87,"sql_types_per_column");
  bVar9 = Deserializer::ReadPropertyWithExplicitDefault<bool>(deserializer,0x88,"columns_set",false)
  ;
  CVar14 = Deserializer::ReadPropertyWithExplicitDefault<duckdb::CSVOption<char>>
                     (deserializer,0x89,"comment",(CSVOption<char>)0x0);
  uVar20 = Deserializer::ReadPropertyWithDefault<unsigned_long>
                     (deserializer,0x8a,"rows_until_header");
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (&options_encoding,deserializer,0x8b,"encoding");
  CVar15 = Deserializer::ReadProperty<duckdb::CSVOption<bool>>(deserializer,0x8c,"strict_mode");
  Deserializer::ReadProperty<duckdb::CSVOption<std::__cxx11::string>>
            (&options_multi_byte_delimiter,deserializer,0x8d,"multi_byte_delimiter");
  SerializedCSVReaderOptions
            (__return_storage_ptr__,single_byte_delimiter,&options_multi_byte_delimiter);
  (__return_storage_ptr__->options).ignore_errors = (CSVOption<bool>)((ushort)bVar1 << 8);
  (__return_storage_ptr__->options).buffer_sample_size = uVar16;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&(__return_storage_ptr__->options).null_str,&options_null_str);
  (__return_storage_ptr__->options).compression = FVar2;
  (__return_storage_ptr__->options).allow_quoted_nulls = bVar3;
  (__return_storage_ptr__->options).maximum_line_size.set_by_user = CVar21.set_by_user;
  (__return_storage_ptr__->options).maximum_line_size.value = CVar21.value;
  (__return_storage_ptr__->options).normalize_names = bVar4;
  ::std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)
             &(__return_storage_ptr__->options).force_not_null,
             &options_force_not_null.super_vector<bool,_std::allocator<bool>_>);
  (__return_storage_ptr__->options).all_varchar = bVar5;
  (__return_storage_ptr__->options).sample_size_chunks = uVar17;
  (__return_storage_ptr__->options).auto_detect = bVar6;
  ::std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->options).file_path,(string *)&options_file_path);
  ::std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->options).decimal_separator,
             (string *)&options_decimal_separator);
  (__return_storage_ptr__->options).null_padding = bVar7;
  MultiFileOptions::operator=(&__return_storage_ptr__->file_options,&file_options);
  ::std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)&(__return_storage_ptr__->options).force_quote,
             &options_force_quote.super_vector<bool,_std::allocator<bool>_>);
  local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)options_rejects_table_name._M_dataplus._M_p == &options_rejects_table_name.field_2) {
    local_370.field_2._8_8_ = options_rejects_table_name.field_2._8_8_;
  }
  else {
    local_370._M_dataplus._M_p = options_rejects_table_name._M_dataplus._M_p;
  }
  local_370._M_string_length = options_rejects_table_name._M_string_length;
  options_rejects_table_name._M_string_length = 0;
  options_rejects_table_name.field_2._M_local_buf[0] = '\0';
  options_rejects_table_name._M_dataplus._M_p = (pointer)&options_rejects_table_name.field_2;
  CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  CSVOption((CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_f0,&local_370);
  CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator=(&(__return_storage_ptr__->options).rejects_table_name,
            (CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_f0);
  ::std::__cxx11::string::~string((string *)(local_f0 + 8));
  ::std::__cxx11::string::~string((string *)&local_370);
  (__return_storage_ptr__->options).rejects_limit = uVar18;
  (__return_storage_ptr__->options).dialect_options.state_machine_options.quote = CVar10;
  (__return_storage_ptr__->options).dialect_options.state_machine_options.escape = CVar11;
  (__return_storage_ptr__->options).dialect_options.header = CVar12;
  (__return_storage_ptr__->options).dialect_options.num_cols = uVar19;
  (__return_storage_ptr__->options).dialect_options.state_machine_options.new_line = CVar13;
  (__return_storage_ptr__->options).dialect_options.skip_rows.set_by_user = CVar22.set_by_user;
  *(undefined4 *)&(__return_storage_ptr__->options).dialect_options.skip_rows.field_0x1 = local_3c7;
  *(uint *)&(__return_storage_ptr__->options).dialect_options.skip_rows.field_0x4 =
       CONCAT31(uStack_3c3,local_3c7._3_1_);
  (__return_storage_ptr__->options).dialect_options.skip_rows.value = CVar22.value;
  ::std::
  _Rb_tree<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>,_std::_Select1st<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
  ::operator=(&(__return_storage_ptr__->options).dialect_options.date_format._M_t,
              &options_dialect_options_date_format._M_t);
  ::std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->options).sniffer_user_mismatch_error,
             (string *)&options_sniffer_user_mismatch_error);
  (__return_storage_ptr__->options).parallel = bVar8;
  ::std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)
             &(__return_storage_ptr__->options).was_type_manually_set,
             &options_was_type_manually_set.super_vector<bool,_std::allocator<bool>_>);
  CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator=(&(__return_storage_ptr__->options).rejects_scan_name,&options_rejects_scan_name);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&(__return_storage_ptr__->options).name_list,&options_name_list);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
            (&(__return_storage_ptr__->options).sql_type_list.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &options_sql_type_list);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::operator=((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)&(__return_storage_ptr__->options).sql_types_per_column,
              &options_sql_types_per_column._M_h);
  (__return_storage_ptr__->options).columns_set = bVar9;
  (__return_storage_ptr__->options).dialect_options.state_machine_options.comment = CVar14;
  (__return_storage_ptr__->options).dialect_options.rows_until_header = uVar20;
  ::std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->options).encoding,(string *)&options_encoding);
  (__return_storage_ptr__->options).dialect_options.state_machine_options.strict_mode = CVar15;
  Deserializer::ReadPropertyWithDefault<bool>
            (deserializer,0x8e,"multi_file_reader",
             &(__return_storage_ptr__->options).multi_file_reader);
  Deserializer::ReadProperty<duckdb::CSVOption<unsigned_long>>
            (deserializer,0x8f,"buffer_size_option",
             &(__return_storage_ptr__->options).buffer_size_option);
  ::std::__cxx11::string::~string((string *)&options_multi_byte_delimiter.value);
  ::std::__cxx11::string::~string((string *)&options_encoding);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&options_sql_types_per_column);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&options_sql_type_list.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&options_name_list);
  ::std::__cxx11::string::~string((string *)&options_rejects_scan_name.value);
  ::std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            ((_Bvector_base<std::allocator<bool>_> *)&options_was_type_manually_set);
  ::std::__cxx11::string::~string((string *)&options_sniffer_user_mismatch_error);
  ::std::
  _Rb_tree<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>,_std::_Select1st<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
  ::~_Rb_tree(&options_dialect_options_date_format._M_t);
  ::std::__cxx11::string::~string((string *)&options_rejects_table_name);
  ::std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            ((_Bvector_base<std::allocator<bool>_> *)&options_force_quote);
  MultiFileOptions::~MultiFileOptions(&file_options);
  ::std::__cxx11::string::~string((string *)&options_decimal_separator);
  ::std::__cxx11::string::~string((string *)&options_file_path);
  ::std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            ((_Bvector_base<std::allocator<bool>_> *)&options_force_not_null);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&options_null_str);
  return __return_storage_ptr__;
}

Assistant:

SerializedCSVReaderOptions SerializedCSVReaderOptions::Deserialize(Deserializer &deserializer) {
	auto options_ignore_errors = deserializer.ReadPropertyWithExplicitDefault<bool>(100, "ignore_errors", false);
	auto options_buffer_sample_size = deserializer.ReadPropertyWithDefault<idx_t>(101, "buffer_sample_size");
	auto options_null_str = deserializer.ReadPropertyWithDefault<vector<string>>(102, "null_str");
	auto options_compression = deserializer.ReadProperty<FileCompressionType>(103, "compression");
	auto options_allow_quoted_nulls = deserializer.ReadPropertyWithDefault<bool>(104, "allow_quoted_nulls");
	auto options_maximum_line_size = deserializer.ReadProperty<CSVOption<idx_t>>(105, "maximum_line_size");
	auto options_normalize_names = deserializer.ReadPropertyWithDefault<bool>(106, "normalize_names");
	auto options_force_not_null = deserializer.ReadPropertyWithDefault<vector<bool>>(107, "force_not_null");
	auto options_all_varchar = deserializer.ReadPropertyWithDefault<bool>(108, "all_varchar");
	auto options_sample_size_chunks = deserializer.ReadPropertyWithDefault<idx_t>(109, "sample_size_chunks");
	auto options_auto_detect = deserializer.ReadPropertyWithDefault<bool>(110, "auto_detect");
	auto options_file_path = deserializer.ReadPropertyWithDefault<string>(111, "file_path");
	auto options_decimal_separator = deserializer.ReadPropertyWithDefault<string>(112, "decimal_separator");
	auto options_null_padding = deserializer.ReadPropertyWithDefault<bool>(113, "null_padding");
	deserializer.ReadDeletedProperty<idx_t>(114, "buffer_size");
	auto file_options = deserializer.ReadProperty<MultiFileOptions>(115, "file_options");
	auto options_force_quote = deserializer.ReadPropertyWithDefault<vector<bool>>(116, "force_quote");
	auto options_rejects_table_name = deserializer.ReadPropertyWithExplicitDefault<string>(117, "rejects_table_name", "reject_errors");
	auto options_rejects_limit = deserializer.ReadPropertyWithDefault<idx_t>(118, "rejects_limit");
	deserializer.ReadDeletedProperty<vector<string>>(119, "rejects_recovery_columns");
	deserializer.ReadDeletedProperty<vector<idx_t>>(120, "rejects_recovery_column_ids");
	auto options_dialect_options_state_machine_options_delimiter = deserializer.ReadProperty<CSVOption<char>>(121, "delimiter");
	auto options_dialect_options_state_machine_options_quote = deserializer.ReadProperty<CSVOption<char>>(122, "quote");
	auto options_dialect_options_state_machine_options_escape = deserializer.ReadProperty<CSVOption<char>>(123, "escape");
	auto options_dialect_options_header = deserializer.ReadProperty<CSVOption<bool>>(124, "header");
	auto options_dialect_options_num_cols = deserializer.ReadPropertyWithDefault<idx_t>(125, "num_cols");
	auto options_dialect_options_state_machine_options_new_line = deserializer.ReadProperty<CSVOption<NewLineIdentifier>>(126, "new_line");
	auto options_dialect_options_skip_rows = deserializer.ReadProperty<CSVOption<idx_t>>(127, "skip_rows");
	auto options_dialect_options_date_format = deserializer.ReadProperty<map<LogicalTypeId, CSVOption<StrpTimeFormat>>>(128, "date_format");
	auto options_sniffer_user_mismatch_error = deserializer.ReadPropertyWithDefault<string>(129, "sniffer_user_mismatch_error");
	auto options_parallel = deserializer.ReadPropertyWithDefault<bool>(130, "parallel");
	auto options_was_type_manually_set = deserializer.ReadPropertyWithDefault<vector<bool>>(131, "was_type_manually_set");
	auto options_rejects_scan_name = deserializer.ReadPropertyWithExplicitDefault<CSVOption<string>>(132, "rejects_scan_name", {"reject_scans"});
	auto options_name_list = deserializer.ReadPropertyWithDefault<vector<string>>(133, "name_list");
	auto options_sql_type_list = deserializer.ReadPropertyWithDefault<vector<LogicalType>>(134, "sql_type_list");
	auto options_sql_types_per_column = deserializer.ReadPropertyWithDefault<case_insensitive_map_t<idx_t>>(135, "sql_types_per_column");
	auto options_columns_set = deserializer.ReadPropertyWithExplicitDefault<bool>(136, "columns_set", false);
	auto options_dialect_options_state_machine_options_comment = deserializer.ReadPropertyWithExplicitDefault<CSVOption<char>>(137, "comment", CSVOption<char>('\0'));
	auto options_dialect_options_rows_until_header = deserializer.ReadPropertyWithDefault<idx_t>(138, "rows_until_header");
	auto options_encoding = deserializer.ReadPropertyWithDefault<string>(139, "encoding");
	auto options_dialect_options_state_machine_options_strict_mode = deserializer.ReadProperty<CSVOption<bool>>(140, "strict_mode");
	auto options_multi_byte_delimiter = deserializer.ReadProperty<CSVOption<string>>(141, "multi_byte_delimiter");
	SerializedCSVReaderOptions result(options_dialect_options_state_machine_options_delimiter, options_multi_byte_delimiter);
	result.options.ignore_errors = options_ignore_errors;
	result.options.buffer_sample_size = options_buffer_sample_size;
	result.options.null_str = std::move(options_null_str);
	result.options.compression = options_compression;
	result.options.allow_quoted_nulls = options_allow_quoted_nulls;
	result.options.maximum_line_size = options_maximum_line_size;
	result.options.normalize_names = options_normalize_names;
	result.options.force_not_null = std::move(options_force_not_null);
	result.options.all_varchar = options_all_varchar;
	result.options.sample_size_chunks = options_sample_size_chunks;
	result.options.auto_detect = options_auto_detect;
	result.options.file_path = std::move(options_file_path);
	result.options.decimal_separator = std::move(options_decimal_separator);
	result.options.null_padding = options_null_padding;
	result.file_options = file_options;
	result.options.force_quote = std::move(options_force_quote);
	result.options.rejects_table_name = std::move(options_rejects_table_name);
	result.options.rejects_limit = options_rejects_limit;
	result.options.dialect_options.state_machine_options.quote = options_dialect_options_state_machine_options_quote;
	result.options.dialect_options.state_machine_options.escape = options_dialect_options_state_machine_options_escape;
	result.options.dialect_options.header = options_dialect_options_header;
	result.options.dialect_options.num_cols = options_dialect_options_num_cols;
	result.options.dialect_options.state_machine_options.new_line = options_dialect_options_state_machine_options_new_line;
	result.options.dialect_options.skip_rows = options_dialect_options_skip_rows;
	result.options.dialect_options.date_format = options_dialect_options_date_format;
	result.options.sniffer_user_mismatch_error = std::move(options_sniffer_user_mismatch_error);
	result.options.parallel = options_parallel;
	result.options.was_type_manually_set = std::move(options_was_type_manually_set);
	result.options.rejects_scan_name = options_rejects_scan_name;
	result.options.name_list = std::move(options_name_list);
	result.options.sql_type_list = std::move(options_sql_type_list);
	result.options.sql_types_per_column = std::move(options_sql_types_per_column);
	result.options.columns_set = options_columns_set;
	result.options.dialect_options.state_machine_options.comment = options_dialect_options_state_machine_options_comment;
	result.options.dialect_options.rows_until_header = options_dialect_options_rows_until_header;
	result.options.encoding = std::move(options_encoding);
	result.options.dialect_options.state_machine_options.strict_mode = options_dialect_options_state_machine_options_strict_mode;
	deserializer.ReadPropertyWithDefault<bool>(142, "multi_file_reader", result.options.multi_file_reader);
	deserializer.ReadProperty<CSVOption<idx_t>>(143, "buffer_size_option", result.options.buffer_size_option);
	return result;
}